

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall jsonnet::internal::anon_unknown_0::Heap::sweep(Heap *this)

{
  value_type pHVar1;
  size_type sVar2;
  reference ppHVar3;
  long in_RDI;
  HeapEntity *x;
  unsigned_long i;
  ulong local_10;
  
  *(char *)(in_RDI + 0x10) = *(char *)(in_RDI + 0x10) + '\x01';
  local_10 = 0;
  while( true ) {
    sVar2 = std::
            vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
            ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                    *)(in_RDI + 0x18));
    if (sVar2 <= local_10) break;
    ppHVar3 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
              ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                            *)(in_RDI + 0x18),local_10);
    pHVar1 = *ppHVar3;
    if (pHVar1->mark != *(GarbageCollectionMark *)(in_RDI + 0x10)) {
      if (pHVar1 != (value_type)0x0) {
        (*pHVar1->_vptr_HeapEntity[1])();
      }
      sVar2 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
              ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                      *)(in_RDI + 0x18));
      if (local_10 != sVar2 - 1) {
        sVar2 = std::
                vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                        *)(in_RDI + 0x18));
        ppHVar3 = std::
                  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                                *)(in_RDI + 0x18),sVar2 - 1);
        pHVar1 = *ppHVar3;
        ppHVar3 = std::
                  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                                *)(in_RDI + 0x18),local_10);
        *ppHVar3 = pHVar1;
      }
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ::pop_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  *)0x231991);
      local_10 = local_10 - 1;
    }
    local_10 = local_10 + 1;
  }
  sVar2 = std::
          vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
          ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  *)(in_RDI + 0x18));
  *(size_type *)(in_RDI + 0x38) = sVar2;
  *(size_type *)(in_RDI + 0x30) = sVar2;
  return;
}

Assistant:

void sweep(void)
    {
        lastMark++;
        // Heap shrinks during this loop.  Do not cache entities.size().
        for (unsigned long i = 0; i < entities.size(); ++i) {
            HeapEntity *x = entities[i];
            if (x->mark != lastMark) {
                delete x;
                if (i != entities.size() - 1) {
                    // Swap it with the back.
                    entities[i] = entities[entities.size() - 1];
                }
                entities.pop_back();
                --i;
            }
        }
        lastNumEntities = numEntities = entities.size();
    }